

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O2

void vkt::QueryPool::anon_unknown_0::beginSecondaryCommandBuffer
               (DeviceInterface *vk,VkCommandBuffer commandBuffer,
               VkQueryPipelineStatisticFlags queryFlags,VkRenderPass renderPass,
               VkFramebuffer framebuffer,VkCommandBufferUsageFlags bufferUsageFlags)

{
  VkResult result;
  VkCommandBufferBeginInfo info;
  VkCommandBufferInheritanceInfo secCmdBufInheritInfo;
  undefined4 local_58 [2];
  undefined8 local_50;
  VkCommandBufferUsageFlags local_48;
  undefined4 *local_40;
  undefined4 local_38 [2];
  undefined8 local_30;
  deUint64 local_28;
  undefined4 local_20;
  deUint64 local_18;
  undefined8 local_10;
  VkQueryPipelineStatisticFlags local_8;
  
  local_40 = local_38;
  local_38[0] = 0x29;
  local_30 = 0;
  local_20 = 0;
  local_10 = 0;
  local_58[0] = 0x2a;
  local_50 = 0;
  local_48 = bufferUsageFlags;
  local_28 = renderPass.m_internal;
  local_18 = framebuffer.m_internal;
  local_8 = queryFlags;
  result = (*vk->_vptr_DeviceInterface[0x49])(vk,commandBuffer,local_58);
  ::vk::checkResult(result,"vk.beginCommandBuffer(commandBuffer, &info)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x92);
  return;
}

Assistant:

void beginSecondaryCommandBuffer (const DeviceInterface&				vk,
								  const VkCommandBuffer					commandBuffer,
								  const VkQueryPipelineStatisticFlags	queryFlags,
								  const VkRenderPass					renderPass = (VkRenderPass)0u,
								  const VkFramebuffer					framebuffer = (VkFramebuffer)0u,
								  const VkCommandBufferUsageFlags		bufferUsageFlags = VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT)
{
	const VkCommandBufferInheritanceInfo	secCmdBufInheritInfo	=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_INHERITANCE_INFO,
		DE_NULL,
		renderPass,					// renderPass
		0u,							// subpass
		framebuffer,				// framebuffer
		VK_FALSE,					// occlusionQueryEnable
		(VkQueryControlFlags)0u,	// queryFlags
		queryFlags,					// pipelineStatistics
	};

	const VkCommandBufferBeginInfo			info					=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType							sType;
		DE_NULL,										// const void*								pNext;
		bufferUsageFlags,								// VkCommandBufferUsageFlags				flags;
		&secCmdBufInheritInfo,							// const VkCommandBufferInheritanceInfo*	pInheritanceInfo;
	};
	VK_CHECK(vk.beginCommandBuffer(commandBuffer, &info));
}